

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

size_t Memory::HeapInfo::Check<Memory::LargeHeapBlock>
                 (bool expectFull,bool expectPending,LargeHeapBlock *list,LargeHeapBlock *tail)

{
  size_t sVar1;
  
  if (list == tail) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      LargeHeapBlock::Check(list,expectFull,expectPending);
      sVar1 = sVar1 + 1;
      list = list->next;
    } while (list != tail);
  }
  return sVar1;
}

Assistant:

size_t
HeapInfo::Check(bool expectFull, bool expectPending, TBlockType * list, TBlockType * tail)
{
    size_t heapBlockCount = 0;
    HeapBlockList::ForEach(list, tail, [&heapBlockCount, expectFull, expectPending](TBlockType * heapBlock)
    {
        heapBlock->Check(expectFull, expectPending);
        heapBlockCount++;
    });
    return heapBlockCount;
}